

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_a_star.cpp
# Opt level: O0

void __thiscall
IDAStarSearch::extend_frontier(IDAStarSearch *this,shared_ptr<Node> *node,int max_value)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Node> local_90;
  int local_80;
  int local_7c;
  int new_value;
  int new_cost;
  pair<int,_int> local_70;
  _Node_iterator_base<std::pair<int,_int>,_true> local_68;
  int local_5c;
  int local_58;
  int new_y;
  int new_x;
  int dy;
  int dx;
  int i;
  int delta_ys [4];
  int delta_xs [4];
  int max_value_local;
  shared_ptr<Node> *node_local;
  IDAStarSearch *this_local;
  
  delta_ys[2] = 0;
  delta_ys[3] = 0;
  _dx = 0xffffffff00000001;
  delta_ys[0] = 0;
  delta_ys[1] = 0;
  for (dy = 0; dy < 4; dy = dy + 1) {
    new_x = delta_ys[(long)dy + 2];
    new_y = (&dx)[dy];
    peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    local_58 = peVar2->x + new_x;
    peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    local_5c = peVar2->y + new_y;
    bVar1 = Maze::is_valid_coordinate(&(this->super_Search).maze,local_58,local_5c);
    if (bVar1) {
      local_70 = std::make_pair<int&,int&>(&local_58,&local_5c);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_set<std::pair<int,_int>,_PointHash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::find(&(this->super_Search).visited_points,&local_70);
      _new_value = (__node_type *)
                   std::
                   unordered_set<std::pair<int,_int>,_PointHash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   ::end(&(this->super_Search).visited_points);
      bVar1 = std::__detail::operator!=
                        (&local_68,(_Node_iterator_base<std::pair<int,_int>,_true> *)&new_value);
      if (!bVar1) {
        peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            node);
        local_7c = (peVar2->field_4).disc_cost + 1;
        local_80 = get_evaluation(this,local_58,local_5c,local_7c);
        if (local_80 <= max_value) {
          std::make_shared<Node,std::shared_ptr<Node>&,int&,int&,int&,int&>
                    (&local_90,(int *)node,&local_58,&local_5c,&local_80);
          std::deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>>::
          emplace_back<std::shared_ptr<Node>>
                    ((deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>> *)
                     &this->frontier,&local_90);
          std::shared_ptr<Node>::~shared_ptr(&local_90);
        }
      }
    }
  }
  return;
}

Assistant:

void IDAStarSearch::extend_frontier(shared_ptr<Node> node, int max_value) {
    // right, left, down, up
    const int delta_xs[] = {0, 0, 1, -1};
    const int delta_ys[] = {1, -1, 0, 0};
    for (int i = 0; i < 4; ++i) {
        auto dx = delta_xs[i];
        auto dy = delta_ys[i];
        int new_x = node->x + dx;
        int new_y = node->y + dy;
        if (not maze.is_valid_coordinate(new_x, new_y)) continue;
        if (visited_points.find(make_pair(new_x, new_y)) != visited_points.end()) continue;
        auto new_cost = node->disc_cost + 1;
        auto new_value = get_evaluation(new_x, new_y, new_cost);
        if (new_value <= max_value) frontier.emplace_back(make_shared<Node>(node, new_x, new_y, new_value, new_cost));
    }
}